

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O3

void __thiscall
DIS::IOCommunicationsNode::marshal(IOCommunicationsNode *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_recordType);
  DataStream::operator<<(dataStream,this->_recordLength);
  DataStream::operator<<(dataStream,this->_communcationsNodeType);
  DataStream::operator<<(dataStream,this->_padding);
  EntityID::marshal(&this->_communicationsNode,dataStream);
  DataStream::operator<<(dataStream,this->_elementID);
  return;
}

Assistant:

void IOCommunicationsNode::marshal(DataStream& dataStream) const
{
    dataStream << _recordType;
    dataStream << _recordLength;
    dataStream << _communcationsNodeType;
    dataStream << _padding;
    _communicationsNode.marshal(dataStream);
    dataStream << _elementID;
}